

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_aggsig_export_secnonce_single(secp256k1_context *ctx,uchar *secnonce32,uchar *seed)

{
  int iVar1;
  secp256k1_scalar secnonce;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_gej pubnonce;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)",
               (ctx->illegal_callback).data);
  }
  else {
    secp256k1_rfc6979_hmac_sha256_initialize(&rng,seed,0x20);
    iVar1 = secp256k1_aggsig_generate_nonce_single(ctx,&secnonce,&pubnonce,&rng);
    if (iVar1 != 0) {
      secp256k1_scalar_get_b32(secnonce32,&secnonce);
      return 1;
    }
  }
  return 0;
}

Assistant:

int secp256k1_aggsig_export_secnonce_single(const secp256k1_context* ctx, unsigned char* secnonce32, const unsigned char* seed) {
    secp256k1_scalar secnonce;
    secp256k1_gej pubnonce;
    secp256k1_rfc6979_hmac_sha256 rng;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(secnonce32 != NULL);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, seed, 32);

    if (secp256k1_aggsig_generate_nonce_single(ctx, &secnonce, &pubnonce, &rng) == 0){
       return 0;
    }

    secp256k1_scalar_get_b32(secnonce32, &secnonce);
    return 1;
}